

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined8 in_RAX;
  char **ppcVar6;
  byte *pbVar7;
  uint uVar8;
  char *pcVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  long lVar11;
  byte *ptr_00;
  int tok;
  undefined8 uStack_38;
  uint uVar9;
  
  ppcVar6 = (char **)(end + -(long)ptr);
  if ((long)ppcVar6 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uStack_38 = in_RAX;
  if (bVar1 < 0x16) {
    if (bVar1 == 5) {
      if (ppcVar6 == (char **)0x1) {
        return -2;
      }
      iVar5 = (*enc[3].literalScanners[0])(enc,ptr,end,ppcVar6);
      lVar11 = 2;
    }
    else if (bVar1 == 6) {
      if (ppcVar6 < (char **)0x3) {
        return -2;
      }
      iVar5 = (*enc[3].literalScanners[1])(enc,ptr,end,ppcVar6);
      lVar11 = 3;
    }
    else {
      if (bVar1 != 7) goto LAB_0040326f;
      if (ppcVar6 < (char **)0x4) {
        return -2;
      }
      iVar5 = (*enc[3].nameMatchesAscii)(enc,ptr,end,(char *)ppcVar6);
      lVar11 = 4;
    }
    if (iVar5 == 0) {
LAB_0040326f:
      *nextTokPtr = ptr;
      return 0;
    }
  }
  else {
    lVar11 = 1;
    if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto LAB_0040326f;
  }
  ptr_00 = (byte *)(ptr + lVar11);
  uVar4 = uStack_38;
  do {
    uVar2 = (long)end - (long)ptr_00;
    if ((long)uVar2 < 1) {
      return -1;
    }
    uStack_38._4_4_ = (int)((ulong)uVar4 >> 0x20);
    uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*ptr_00);
    uVar8 = uVar9 - 5;
    if (0x18 < uVar8) {
switchD_004031f4_caseD_8:
      pbVar7 = ptr_00;
LAB_004033bd:
      *nextTokPtr = (char *)pbVar7;
      return 0;
    }
    lVar11 = 1;
    pcVar10 = (char *)((long)&switchD_004031f4::switchdataD_0057242c +
                      (long)(int)(&switchD_004031f4::switchdataD_0057242c)[uVar8]);
    uStack_38 = uVar4;
    switch(uVar9) {
    case 5:
      if (uVar2 == 1) {
        return -2;
      }
      iVar5 = (*enc[3].scanners[0])(enc,(char *)ptr_00,pcVar10,(char **)0x1);
      lVar11 = 2;
      break;
    case 6:
      if (uVar2 < 3) {
        return -2;
      }
      iVar5 = (*enc[3].scanners[1])(enc,(char *)ptr_00,pcVar10,(char **)0x1);
      lVar11 = 3;
      break;
    case 7:
      if (uVar2 < 4) {
        return -2;
      }
      iVar5 = (*enc[3].scanners[2])(enc,(char *)ptr_00,pcVar10,(char **)0x1);
      lVar11 = 4;
      break;
    default:
      goto switchD_004031f4_caseD_8;
    case 9:
    case 10:
    case 0x15:
      iVar5 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar5 == 0) goto switchD_004031f4_caseD_1d;
      pbVar7 = ptr_00 + 1;
      uVar4 = extraout_RDX;
      uVar3 = uStack_38;
      goto joined_r0x004032a7;
    case 0xf:
      iVar5 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar5 == 0) goto switchD_004031f4_caseD_1d;
      pbVar7 = ptr_00 + 1;
      if ((byte *)end == pbVar7 || (long)end - (long)pbVar7 < 0) {
        return -1;
      }
      if (*pbVar7 != 0x3e) goto LAB_004033bd;
      goto LAB_004033a2;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004031f4_caseD_16;
    case 0x1d:
      goto switchD_004031f4_caseD_1d;
    }
    uVar4 = uStack_38;
    if (iVar5 == 0) goto switchD_004031f4_caseD_1d;
switchD_004031f4_caseD_16:
    uStack_38 = uVar4;
    ptr_00 = ptr_00 + lVar11;
    uVar4 = uStack_38;
  } while( true );
joined_r0x004032a7:
  ptr_00 = pbVar7;
  uVar2 = (long)end - (long)ptr_00;
  if ((long)uVar2 < 1) {
    return -1;
  }
  uStack_38._4_4_ = (int)((ulong)uVar3 >> 0x20);
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*ptr_00);
  if (0xf < (ulong)bVar1) {
switchD_004032cc_caseD_2:
    pbVar7 = ptr_00 + 1;
    goto joined_r0x004032a7;
  }
  uStack_38 = uVar3;
  switch(bVar1) {
  case 0:
  case 1:
  case 8:
switchD_004031f4_caseD_1d:
    *nextTokPtr = (char *)ptr_00;
    return 0;
  default:
    goto switchD_004032cc_caseD_2;
  case 5:
    if (uVar2 == 1) {
      return -2;
    }
    iVar5 = (*enc[3].nameLength)(enc,(char *)ptr_00);
    if (iVar5 != 0) goto switchD_004031f4_caseD_1d;
    pbVar7 = ptr_00 + 2;
    uVar4 = extraout_RDX_00;
    uVar3 = uStack_38;
    break;
  case 6:
    if (uVar2 < 3) {
      return -2;
    }
    pcVar10 = (*enc[3].skipS)(enc,(char *)ptr_00);
    if ((int)pcVar10 != 0) goto switchD_004031f4_caseD_1d;
    pbVar7 = ptr_00 + 3;
    uVar4 = extraout_RDX_01;
    uVar3 = uStack_38;
    break;
  case 7:
    if (uVar2 < 4) {
      return -2;
    }
    iVar5 = (*enc[3].getAtts)(enc,(char *)ptr_00,(int)uVar4,
                              (ATTRIBUTE *)
                              ((long)&switchD_004032cc::switchdataD_00572490 +
                              (long)(int)(&switchD_004032cc::switchdataD_00572490)[bVar1]));
    if (iVar5 != 0) goto switchD_004031f4_caseD_1d;
    pbVar7 = ptr_00 + 4;
    uVar4 = extraout_RDX_02;
    uVar3 = uStack_38;
    break;
  case 0xf:
    pbVar7 = ptr_00 + 1;
    if ((byte *)end == pbVar7 || (long)end - (long)pbVar7 < 0) {
      return -1;
    }
    if (*pbVar7 == 0x3e) {
LAB_004033a2:
      *nextTokPtr = (char *)(ptr_00 + 2);
      return uStack_38._4_4_;
    }
  }
  goto joined_r0x004032a7;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr,
               const char *end, const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}